

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

int __thiscall btQuantizedBvh::calcSplittingAxis(btQuantizedBvh *this,int startIndex,int endIndex)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btVector3 bVar12;
  btVector3 bVar13;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 local_38;
  undefined4 uStack_34;
  
  fVar11 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  iVar1 = startIndex;
  if (endIndex - startIndex != 0 && startIndex <= endIndex) {
    do {
      bVar12 = getAabbMax(this,iVar1);
      bVar13 = getAabbMin(this,iVar1);
      local_68 = bVar12.m_floats[0];
      uStack_64 = bVar12.m_floats[1];
      fVar11 = fVar11 + (local_68 + bVar13.m_floats[0]) * 0.5;
      local_58 = bVar12.m_floats[2];
      fVar6 = fVar6 + (bVar13.m_floats[1] + uStack_64) * 0.5;
      fVar7 = fVar7 + (bVar13.m_floats[2] + local_58) * 0.5;
      iVar1 = iVar1 + 1;
    } while (endIndex != iVar1);
  }
  fVar2 = (float)(endIndex - startIndex);
  fVar9 = 0.0;
  fVar3 = 0.0;
  fVar5 = 0.0;
  if (startIndex < endIndex) {
    fVar4 = 1.0 / fVar2;
    fVar3 = 0.0;
    fVar5 = 0.0;
    do {
      bVar12 = getAabbMax(this,startIndex);
      bVar13 = getAabbMin(this,startIndex);
      local_38 = bVar12.m_floats[0];
      uStack_34 = bVar12.m_floats[1];
      fVar10 = (local_38 + bVar13.m_floats[0]) * 0.5 - fVar11 * fVar4;
      fVar9 = fVar9 + fVar10 * fVar10;
      local_68 = bVar12.m_floats[2];
      fVar10 = (bVar13.m_floats[1] + uStack_34) * 0.5 - fVar4 * fVar6;
      fVar8 = (bVar13.m_floats[2] + local_68) * 0.5 - fVar4 * fVar7;
      fVar3 = fVar3 + fVar10 * fVar10;
      fVar5 = fVar5 + fVar8 * fVar8;
      startIndex = startIndex + 1;
    } while (endIndex != startIndex);
  }
  fVar6 = 1.0 / (fVar2 + -1.0);
  iVar1 = (uint)(fVar9 * fVar6 < fVar6 * fVar5) * 2;
  if (fVar9 * fVar6 < fVar6 * fVar3) {
    iVar1 = (fVar6 * fVar3 < fVar6 * fVar5) + 1;
  }
  return iVar1;
}

Assistant:

int	btQuantizedBvh::calcSplittingAxis(int startIndex,int endIndex)
{
	int i;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	btVector3 variance(btScalar(0.),btScalar(0.),btScalar(0.));
	int numIndices = endIndex-startIndex;

	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);
		
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		btVector3 diff2 = center-means;
		diff2 = diff2 * diff2;
		variance += diff2;
	}
	variance *= (btScalar(1.)/	((btScalar)numIndices-1)	);
	
	return variance.maxAxis();
}